

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  int iVar2;
  ImU32 IVar3;
  uint uVar4;
  GetterYs<signed_char> *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  int iVar10;
  ImDrawIdx IVar11;
  ImVec2 IVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pGVar5 = this->Getter;
  iVar10 = pGVar5->Count;
  iVar2 = this->Transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar2].Min;
  IVar12.x = (float)(GImPlot->Mx *
                     (((double)(prim + 1) * pGVar5->XScale + pGVar5->X0) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  IVar12.y = (float)(GImPlot->My[iVar2] *
                     ((double)(int)pGVar5->Ys
                                   [(long)(((prim + 1 + pGVar5->Offset) % iVar10 + iVar10) % iVar10)
                                    * (long)pGVar5->Stride] -
                     GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y);
  fVar13 = (this->P1).x;
  fVar14 = (this->P1).y;
  auVar16._0_4_ = ~-(uint)(IVar12.x <= fVar13) & (uint)IVar12.x;
  auVar16._4_4_ = ~-(uint)(IVar12.y <= fVar14) & (uint)IVar12.y;
  auVar16._8_4_ = ~-(uint)(fVar13 < IVar12.x) & (uint)IVar12.x;
  auVar16._12_4_ = ~-(uint)(fVar14 < IVar12.y) & (uint)IVar12.y;
  auVar8._4_4_ = (uint)fVar14 & -(uint)(IVar12.y <= fVar14);
  auVar8._0_4_ = (uint)fVar13 & -(uint)(IVar12.x <= fVar13);
  auVar8._8_4_ = (uint)fVar13 & -(uint)(fVar13 < IVar12.x);
  auVar8._12_4_ = (uint)fVar14 & -(uint)(fVar14 < IVar12.y);
  auVar16 = auVar16 | auVar8;
  fVar15 = (cull_rect->Min).y;
  auVar9._4_8_ = auVar16._8_8_;
  auVar9._0_4_ = -(uint)(auVar16._4_4_ < fVar15);
  auVar17._0_8_ = auVar9._0_8_ << 0x20;
  auVar17._8_4_ = -(uint)(auVar16._8_4_ < (cull_rect->Max).x);
  auVar17._12_4_ = -(uint)(auVar16._12_4_ < (cull_rect->Max).y);
  auVar18._4_4_ = -(uint)(fVar15 < auVar16._4_4_);
  auVar18._0_4_ = -(uint)((cull_rect->Min).x < auVar16._0_4_);
  auVar18._8_8_ = auVar17._8_8_;
  iVar10 = movmskps((int)GImPlot,auVar18);
  if (iVar10 == 0xf) {
    fVar15 = fVar14 + this->HalfWeight;
    fVar14 = fVar14 - this->HalfWeight;
    IVar3 = this->Col;
    IVar1 = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    (pIVar6->pos).x = fVar13;
    (pIVar6->pos).y = fVar15;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = IVar3;
    pIVar6[1].pos.x = IVar12.x;
    pIVar6[1].pos.y = fVar14;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = IVar3;
    pIVar6[2].pos.x = fVar13;
    pIVar6[2].pos.y = fVar14;
    pIVar6[2].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = IVar3;
    pIVar6[3].pos.x = IVar12.x;
    pIVar6[3].pos.y = fVar15;
    pIVar6[3].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar6 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar11 = (ImDrawIdx)uVar4;
    *pIVar7 = IVar11;
    pIVar7[1] = IVar11 + 1;
    pIVar7[2] = IVar11 + 2;
    pIVar7[3] = IVar11;
    pIVar7[4] = IVar11 + 1;
    pIVar7[5] = IVar11 + 3;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar4 + 4;
    fVar14 = IVar12.x - this->HalfWeight;
    fVar13 = this->HalfWeight + IVar12.x;
    fVar15 = (this->P1).y;
    IVar3 = this->Col;
    IVar1 = *uv;
    pIVar6[4].pos.x = fVar14;
    pIVar6[4].pos.y = IVar12.y;
    DrawList->_VtxWritePtr->uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = IVar3;
    pIVar6[1].pos.x = fVar13;
    pIVar6[1].pos.y = fVar15;
    DrawList->_VtxWritePtr[1].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = IVar3;
    pIVar6[2].pos.x = fVar14;
    pIVar6[2].pos.y = fVar15;
    pIVar6[2].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = IVar3;
    pIVar6[3].pos.x = fVar13;
    pIVar6[3].pos.y = IVar12.y;
    pIVar6[3].uv = IVar1;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar6 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar11 = (ImDrawIdx)uVar4;
    *pIVar7 = IVar11;
    pIVar7[1] = IVar11 + 1;
    pIVar7[2] = IVar11 + 2;
    pIVar7[3] = IVar11;
    pIVar7[4] = IVar11 + 1;
    pIVar7[5] = IVar11 + 3;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar4 + 4;
  }
  this->P1 = IVar12;
  return (char)iVar10 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }